

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

int __thiscall
section_data::slice_vertical_angled(section_data *this,int *line_start,int *line_end,int *layer)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  intercept_data intercept;
  
  iVar1 = *line_start;
  dVar6 = (double)iVar1;
  dVar5 = (double)this->x1;
  if ((dVar5 <= dVar6) && (dVar6 <= (double)this->x2)) {
    dVar2 = (double)line_start[1];
    dVar3 = (double)line_end[1];
    dVar4 = (double)this->y2;
    dVar7 = (double)this->y1;
    dVar6 = dVar6 - dVar5;
    dVar5 = round(((dVar4 - dVar7) / ((double)this->x2 - dVar5)) * dVar6 + dVar7);
    if ((((dVar5 < dVar7) && ((dVar4 < dVar7 && (dVar4 < dVar5)))) ||
        ((dVar5 < dVar4 && ((dVar7 < dVar4 && (dVar7 < dVar5)))))) &&
       (((dVar5 <= dVar2 && ((dVar3 < dVar2 && (dVar3 <= dVar5)))) ||
        ((dVar5 <= dVar3 && ((dVar2 < dVar3 && (dVar2 <= dVar5)))))))) {
      intercept.y = (int)dVar5;
      intercept.x = iVar1;
      dVar5 = dVar6 * dVar6 + (dVar5 - dVar7) * (dVar5 - dVar7);
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar5 = round(dVar5);
      intercept.dist = (int)dVar5;
      push_intercept(this,layer,intercept);
    }
  }
  return 0;
}

Assistant:

int section_data::slice_vertical_angled(int line_start[2], int line_end[2],
                                        int &layer)
{
  double xa = (double)line_start[0];
  double ya = (double)line_start[1];
  double yb = (double)line_end[1];
  if ((xa >= (double)x1) && (xa <= (double)x2)) {
    double m = ((double)y2 - (double)y1) / ((double)x2 - (double)x1);
    double y_int = round(m * (xa - (double)x1) + (double)y1);
    if ((((double)y1 > (double)y2) && (y_int > (double)y2) &&
         (y_int < (double)y1)) ||
        (((double)y1 < (double)y2) && (y_int > (double)y1) &&
         y_int < (double)y2)) {
      if (((ya > yb) && (y_int >= yb) && (y_int <= ya)) ||
          ((ya < yb) && (y_int >= ya) && (y_int <= yb))) {
        intercept_data tempy;
        tempy.x = (int)xa;
        tempy.y = (int)y_int;
        tempy.dist =
            (int)round((sqrt((xa - (double)x1) * (xa - (double)x1) +
                             (y_int - (double)y1) * (y_int - (double)y1))));
        push_intercept(layer, tempy);
      }
    }
  }
  return EXIT_SUCCESS;
}